

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.cpp
# Opt level: O0

void __thiscall
pbrt::FilmHandle::WriteImage(FilmHandle *this,ImageMetadata *metadata,Float splatScale)

{
  anon_class_16_2_f4fbedd2 func;
  TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm> *in_RSI;
  ImageMetadata *in_RDI;
  Float *unaff_retaddr;
  anon_class_16_2_f4fbedd2 write;
  
  func.splatScale = unaff_retaddr;
  func.metadata = in_RDI;
  TaggedPointer<pbrt::RGBFilm,pbrt::GBufferFilm>::
  DispatchCPU<pbrt::FilmHandle::WriteImage(pbrt::ImageMetadata,float)::__0>(in_RSI,func);
  return;
}

Assistant:

void FilmHandle::WriteImage(ImageMetadata metadata, Float splatScale) {
    auto write = [&](auto ptr) { return ptr->WriteImage(metadata, splatScale); };
    return DispatchCPU(write);
}